

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O2

Directory * __thiscall
CompoundFile::File::directory(Directory *__return_storage_ptr__,File *this,wstring *name)

{
  __type _Var1;
  _Base_ptr p_Var2;
  Exception *this_00;
  allocator local_71;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  
  p_Var2 = (this->m_dirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(this->m_dirs)._M_t._M_impl.super__Rb_tree_header) {
      this_00 = (Exception *)__cxa_allocate_exception(0x30);
      std::__cxx11::wstring::wstring
                ((wstring *)&local_70,L"There is no such directory : ",&local_71);
      std::operator+(&local_50,&local_70,name);
      Exception::Exception(this_00,&local_50);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    _Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)&p_Var2[1]._M_parent,name);
    if (_Var1) break;
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  Directory::Directory(__return_storage_ptr__,(Directory *)&p_Var2[1]._M_parent);
  return __return_storage_ptr__;
}

Assistant:

inline Directory
File::directory( const std::wstring & name ) const
{
	for( std::map< int32_t, Directory >::const_iterator it = m_dirs.begin(),
		last = m_dirs.end(); it != last; ++it )
	{
		if( it->second.name() == name )
			return it->second;
	}

	throw Exception( std::wstring( L"There is no such directory : " ) + name );
}